

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

void __thiscall pg::PTLSolver::solve(PTLSolver *this)

{
  bitset *src;
  bitset *Z;
  uint64_t *puVar1;
  ulong *puVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  bitset CurG;
  bool local_59;
  bitset local_50;
  
  local_50._size = ((this->super_Solver).game)->n_vertices;
  uVar11 = local_50._size + 0x3f;
  local_50._bitssize = uVar11 >> 6;
  uVar10 = local_50._bitssize << 3;
  local_50._allocsize = uVar10;
  local_50._bits = (uint64_t *)operator_new__(uVar10);
  if (0x3f < uVar11) {
    memset(local_50._bits,0,uVar10);
  }
  src = &this->G;
  Z = &this->S0;
  bVar6 = true;
  this->iterations = 0;
  local_59 = true;
  do {
    sVar9 = 0;
    do {
      if ((this->G)._bitssize == sVar9) goto LAB_00172fbe;
      puVar1 = (this->G)._bits + sVar9;
      sVar9 = sVar9 + 1;
    } while (*puVar1 == 0);
    this->iterations = this->iterations + 1;
    if (this->multiplayer == false) {
      if (bVar6) {
        do {
          this->iterations = this->iterations + 1;
          if ((this->super_Solver).trace != 0) {
            poVar8 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->iterations + -1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m, player Even\n",0x11);
          }
          bitset::operator=(&local_50,src);
          bVar6 = search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,0);
          iVar7 = (this->SolvedQ0).pointer;
          if (iVar7 != 0) {
            puVar5 = (this->Q).queue;
            (this->Q).queue = (this->SolvedQ0).queue;
            (this->SolvedQ0).queue = puVar5;
            iVar3 = (this->Q).pointer;
            (this->Q).pointer = iVar7;
            (this->SolvedQ0).pointer = iVar3;
            do {
              (this->Q).pointer = iVar7 + -1;
              uVar4 = (this->Q).queue[(long)iVar7 + -1];
              uVar10 = (ulong)(int)uVar4;
              if (((((this->super_Solver).game)->solved)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1)
                  == 0) {
                Oink::solve((this->super_Solver).oink,uVar4,0,this->str[uVar10]);
              }
              puVar2 = (this->G)._bits + (uVar10 >> 6);
              *puVar2 = *puVar2 & ~(1L << (uVar10 & 0x3f));
              attractVertices(this,0,uVar4,src,Z,src);
              attractTangles(this,0,uVar4,src,Z,src);
              iVar7 = (this->Q).pointer;
            } while (iVar7 != 0);
          }
        } while (bVar6);
        bVar6 = false;
      }
      if (local_59 != false) {
        if ((this->super_Solver).trace != 0) {
          poVar8 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->iterations + -1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m, player Odd\n",0x10);
        }
        bitset::operator=(&local_50,src);
        local_59 = search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,1);
      }
    }
    else {
      if ((this->super_Solver).trace != 0) {
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->iterations + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m\n",4);
      }
      bitset::operator=(&local_50,src);
      search(this,&local_50,(int)((this->super_Solver).game)->n_vertices + -1,-1);
    }
    iVar7 = (this->SolvedQ0).pointer;
    if (iVar7 != 0) {
      puVar5 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ0).queue;
      (this->SolvedQ0).queue = puVar5;
      iVar3 = (this->Q).pointer;
      (this->Q).pointer = iVar7;
      (this->SolvedQ0).pointer = iVar3;
      do {
        (this->Q).pointer = iVar7 + -1;
        uVar4 = (this->Q).queue[(long)iVar7 + -1];
        uVar10 = (ulong)(int)uVar4;
        if (((((this->super_Solver).game)->solved)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0)
        {
          Oink::solve((this->super_Solver).oink,uVar4,0,this->str[uVar10]);
        }
        puVar2 = (this->G)._bits + (uVar10 >> 6);
        *puVar2 = *puVar2 & ~(1L << (uVar10 & 0x3f));
        attractVertices(this,0,uVar4,src,Z,src);
        attractTangles(this,0,uVar4,src,Z,src);
        iVar7 = (this->Q).pointer;
      } while (iVar7 != 0);
    }
    iVar7 = (this->SolvedQ1).pointer;
    if (iVar7 != 0) {
      puVar5 = (this->Q).queue;
      (this->Q).queue = (this->SolvedQ1).queue;
      (this->SolvedQ1).queue = puVar5;
      iVar3 = (this->Q).pointer;
      (this->Q).pointer = iVar7;
      (this->SolvedQ1).pointer = iVar3;
      do {
        (this->Q).pointer = iVar7 + -1;
        uVar4 = (this->Q).queue[(long)iVar7 + -1];
        uVar10 = (ulong)(int)uVar4;
        if (((((this->super_Solver).game)->solved)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0)
        {
          Oink::solve((this->super_Solver).oink,uVar4,1,this->str[uVar10]);
        }
        puVar2 = (this->G)._bits + (uVar10 >> 6);
        *puVar2 = *puVar2 & ~(1L << (uVar10 & 0x3f));
        attractVertices(this,1,uVar4,src,&this->S1,src);
        attractTangles(this,1,uVar4,src,&this->S1,src);
        iVar7 = (this->Q).pointer;
      } while (iVar7 != 0);
    }
  } while ((bVar6) || (local_59 != false));
LAB_00172fbe:
  if (local_50._bits != (uint64_t *)0x0) {
    operator_delete__(local_50._bits);
  }
  return;
}

Assistant:

void
PTLSolver::solve()
{
    bitset CurG(nodecount());

    iterations = 0;

    bool play0 = true;
    bool play1 = true;

    while (G.any()) {
        iterations++;

        if (multiplayer) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m\n";
            CurG = G;
            search(CurG, nodecount()-1, -1);
        } else {
            // play for player 0 until no changes, then player 1

            while (play0) {
                iterations++;
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Even\n";
                CurG = G;
                play0 = search(CurG, nodecount()-1, 0);

                if (SolvedQ0.nonempty()) {
                    Q.swap(SolvedQ0);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        // TODO: should we need the check?
                        if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                        G[v] = false; // remove from Game
                        attractVertices(0, v, G, S0, G);
                        attractTangles(0, v, G, S0, G);
                    }
                }
            }

            if (play1) {
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Odd\n";
                CurG = G;
                play1 = search(CurG, nodecount()-1, 1);
            }
        }

        /**
         * Extend any dominions that were found.
         * (Any solved vertices are now in <Q>.)
         */

        if (SolvedQ0.nonempty()) {
            Q.swap(SolvedQ0);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                G[v] = false; // remove from Game
                attractVertices(0, v, G, S0, G);
                attractTangles(0, v, G, S0, G);
            }
        }

        if (SolvedQ1.nonempty()) {
            Q.swap(SolvedQ1);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 1, str[v]);
                G[v] = false; // remove from Game
                attractVertices(1, v, G, S1, G);
                attractTangles(1, v, G, S1, G);
            }
        }

        if (!play0 and !play1) break;

#if NDEBUG and 0
        if (iterations == 1000) {
            logger << "stuck\n";
            exit(-1);
        }
#endif
    }
}